

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLExtensions.cpp
# Opt level: O0

void sf::priv::ensureExtensionsInit(void)

{
  int iVar1;
  byte *pbVar2;
  ostream *poVar3;
  GLubyte *version;
  int minorVersion;
  int majorVersion;
  
  if (!ensureExtensionsInit::initialized) {
    ensureExtensionsInit::initialized = true;
    sfogl_LoadFunctions();
    version._4_4_ = 0;
    version._0_4_ = 0;
    glGetIntegerv(0x821b,(long)&version + 4);
    glGetIntegerv(0x821c,&version);
    iVar1 = glGetError();
    if (iVar1 == 0x500) {
      pbVar2 = (byte *)glGetString(0x1f02);
      if (pbVar2 == (byte *)0x0) {
        version._4_4_ = 1;
        version._0_4_ = 1;
      }
      else {
        version._4_4_ = *pbVar2 - 0x30;
        version._0_4_ = pbVar2[2] - 0x30;
      }
    }
    if ((version._4_4_ < 1) || ((version._4_4_ == 1 && ((int)version < 1)))) {
      poVar3 = err();
      poVar3 = std::operator<<(poVar3,"sfml-graphics requires support for OpenGL 1.1 or greater");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = err();
      poVar3 = std::operator<<(poVar3,"Ensure that hardware acceleration is enabled if available");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void ensureExtensionsInit()
{
#if !defined(SFML_OPENGL_ES)
    static bool initialized = false;
    if (!initialized)
    {
        initialized = true;

        sfogl_LoadFunctions();

        // Retrieve the context version number
        int majorVersion = 0;
        int minorVersion = 0;

        // Try the new way first
        glGetIntegerv(GL_MAJOR_VERSION, &majorVersion);
        glGetIntegerv(GL_MINOR_VERSION, &minorVersion);

        if (glGetError() == GL_INVALID_ENUM)
        {
            // Try the old way
            const GLubyte* version = glGetString(GL_VERSION);
            if (version)
            {
                // The beginning of the returned string is "major.minor" (this is standard)
                majorVersion = version[0] - '0';
                minorVersion = version[2] - '0';
            }
            else
            {
                // Can't get the version number, assume 1.1
                majorVersion = 1;
                minorVersion = 1;
            }
        }

        if ((majorVersion < 1) || ((majorVersion == 1) && (minorVersion < 1)))
        {
            err() << "sfml-graphics requires support for OpenGL 1.1 or greater" << std::endl;
            err() << "Ensure that hardware acceleration is enabled if available" << std::endl;
        }
    }
#endif
}